

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.cpp
# Opt level: O0

int showgetposition_setposition_Pololu
              (int *showgetposition,int *setposition,BOOL *bConnected,int threadperiod,
              POLOLU *pololu,int deviceid)

{
  int iVar1;
  uint local_40;
  int local_3c;
  int ivalue;
  int deviceid_local;
  POLOLU *pololu_local;
  BOOL *pBStack_28;
  int threadperiod_local;
  BOOL *bConnected_local;
  int *setposition_local;
  int *showgetposition_local;
  
  local_40 = 0;
  local_3c = deviceid;
  _ivalue = pololu;
  pololu_local._4_4_ = threadperiod;
  pBStack_28 = bConnected;
  bConnected_local = setposition;
  setposition_local = showgetposition;
  if ((-1 < *showgetposition) && (*showgetposition < 0x18)) {
    iVar1 = GetValuePololu(pololu,*showgetposition,(int *)&local_40);
    if (iVar1 != 0) {
      printf("Connection to a Pololu lost.\n");
      *pBStack_28 = 0;
      DisconnectPololu(_ivalue);
      mSleep((long)pololu_local._4_4_);
      return 1;
    }
    mSleep(10);
    printf("%d\n",(ulong)local_40);
    EnterCriticalSection(&StateVariablesCS);
    ShowGetPositionMaestroPololu[local_3c] = -1;
    LeaveCriticalSection(&StateVariablesCS);
    *setposition_local = -1;
  }
  if ((-1 < *bConnected_local % 100) && (*bConnected_local % 100 < 0x18)) {
    iVar1 = SetPWMPololu(_ivalue,*bConnected_local % 100,*bConnected_local / 100);
    if (iVar1 != 0) {
      printf("Connection to a Pololu lost.\n");
      *pBStack_28 = 0;
      DisconnectPololu(_ivalue);
      mSleep((long)pololu_local._4_4_);
      return 1;
    }
    mSleep(10);
    EnterCriticalSection(&StateVariablesCS);
    SetPositionMaestroPololu[local_3c] = -1;
    LeaveCriticalSection(&StateVariablesCS);
    *bConnected_local = -1;
  }
  return 0;
}

Assistant:

int showgetposition_setposition_Pololu(int& showgetposition, int& setposition, BOOL& bConnected, int threadperiod, POLOLU& pololu, int deviceid)
{
	int ivalue = 0;

	if ((showgetposition >= 0)&&(showgetposition < NB_CHANNELS_PWM_POLOLU))
	{
		if (GetValuePololu(&pololu, showgetposition, &ivalue) != EXIT_SUCCESS)
		{
			printf("Connection to a Pololu lost.\n");
			bConnected = FALSE;
			DisconnectPololu(&pololu);
			mSleep(threadperiod);
			return EXIT_FAILURE;
		}
		mSleep(10);
		printf("%d\n", ivalue);
		EnterCriticalSection(&StateVariablesCS);
		ShowGetPositionMaestroPololu[deviceid] = -1;
		LeaveCriticalSection(&StateVariablesCS);
		showgetposition = -1;
	}
	if (((setposition%100) >= 0)&&((setposition%100) < NB_CHANNELS_PWM_POLOLU))
	{
		if (SetPWMPololu(&pololu, (setposition%100), (setposition/100)) != EXIT_SUCCESS)
		{
			printf("Connection to a Pololu lost.\n");
			bConnected = FALSE;
			DisconnectPololu(&pololu);
			mSleep(threadperiod);
			return EXIT_FAILURE;
		}
		mSleep(10);
		EnterCriticalSection(&StateVariablesCS);
		SetPositionMaestroPololu[deviceid] = -1;
		LeaveCriticalSection(&StateVariablesCS);
		setposition = -1;
	}

	return EXIT_SUCCESS;
}